

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O0

int rt_input_size(rt_context_pointer context,size_t index)

{
  undefined8 *puVar1;
  int local_4c;
  int iStack_48;
  int size;
  rt_variable_t v;
  rt_context_t *c;
  int i;
  size_t index_local;
  rt_context_pointer context_local;
  
  puVar1 = (undefined8 *)
           (*(long *)((long)context + 0x18) +
           (long)*(int *)(*(long *)((long)context + 0x38) + index * 4) * 0x20);
  local_4c = 1;
  for (c._4_4_ = 0; iStack_48 = (int)*puVar1, c._4_4_ < iStack_48; c._4_4_ = c._4_4_ + 1) {
    local_4c = *(int *)(puVar1[1] + (long)c._4_4_ * 4) * local_4c;
  }
  return local_4c;
}

Assistant:

int rt_input_size(rt_context_pointer context, size_t index) {
  int i; // Iterator

  rt_context_t *c = context;
  rt_variable_t v = c->variables[c->input_variable_ids[index]];

  int size = 1;
  for (i = 0; i < v.shape.size; i++) {
    size *= v.shape.data[i];
  }

  return size;
}